

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_3,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_3> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  Matrix<float,_3,_3> *pMVar2;
  float *pfVar3;
  Vector<float,_3> *pVVar4;
  Vector<float,_3> *pVVar5;
  int r;
  long lVar6;
  int row;
  long lVar7;
  int c;
  long lVar8;
  undefined4 uVar9;
  Matrix<float,_3,_3> retVal;
  
  pMVar2 = __return_storage_ptr__;
  pfVar3 = (float *)&retVal;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[2] = 0.0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar6 != lVar8) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar9;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x24);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar6 = lVar6 + 0xc;
  } while (lVar7 != 3);
  pVVar4 = (Vector<float,_3> *)&retVal;
  lVar6 = 0;
  do {
    fVar1 = a->m_data[lVar6];
    lVar7 = 0;
    pVVar5 = pVVar4;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] =
           *(float *)(this + lVar7 * 4) * fVar1;
      lVar7 = lVar7 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pVVar4 = (Vector<float,_3> *)(pVVar4->m_data + 1);
  } while (lVar6 != 3);
  pVVar4 = (__return_storage_ptr__->m_data).m_data;
  pVVar4[1].m_data[1] = 0.0;
  pVVar4[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar6 = 0;
  lVar7 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar6 != lVar8) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar9;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x24);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar6 = lVar6 + 0xc;
  } while (lVar7 != 3);
  pVVar4 = (Vector<float,_3> *)&retVal;
  lVar6 = 0;
  do {
    lVar7 = 0;
    pVVar5 = pVVar4;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)((Vector<float,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar7] =
           ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0];
      lVar7 = lVar7 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    __return_storage_ptr__ = (Matrix<float,_3,_3> *)((long)__return_storage_ptr__ + 0xc);
    pVVar4 = (Vector<float,_3> *)(pVVar4->m_data + 1);
  } while (lVar6 != 3);
  return pMVar2;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}